

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void copy2buff(StkId top,int n,char *buff)

{
  lua_CFunction p_Var1;
  char *__assertion;
  long lVar2;
  long lVar3;
  LuaType *pLVar4;
  size_t __n;
  
  lVar2 = (long)n + 1;
  pLVar4 = &top[-(long)n].tt_;
  lVar3 = 0;
  do {
    if ((*pLVar4 & 0xf) != 4) {
      __assertion = "(((((((top - n))->tt_)) & 0x0F)) == (4))";
LAB_001268e4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x31a,"void copy2buff(StkId, int, char *)");
    }
    p_Var1 = (((TValue *)(pLVar4 + -4))->value_).f;
    if (((byte)p_Var1[8] & 0xf) != 4) {
      __assertion = "(((((top - n)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_001268e4;
    }
    if (p_Var1[8] == (_func_int_lua_State_ptr)0x4) {
      __n = (size_t)(byte)p_Var1[0xb];
    }
    else {
      __n = *(size_t *)(p_Var1 + 0x10);
    }
    memcpy(buff + lVar3,p_Var1 + 0x18,__n);
    lVar3 = lVar3 + __n;
    lVar2 = lVar2 + -1;
    pLVar4 = pLVar4 + 8;
    if (lVar2 < 2) {
      return;
    }
  } while( true );
}

Assistant:

static void copy2buff (StkId top, int n, char *buff) {
  size_t tl = 0;  /* size already copied */
  do {
    size_t l = vslen(top - n);  /* length of string being copied */
    memcpy(buff + tl, svalue(top - n), l * sizeof(char));
    tl += l;
  } while (--n > 0);
}